

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_scanner.hpp
# Opt level: O2

void __thiscall
duckdb::BaseScanner::Process<duckdb::ColumnCountResult>(BaseScanner *this,ColumnCountResult *result)

{
  shared_ptr<duckdb::CSVStateMachine,_true> *this_00;
  ulong uVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  CSVState CVar5;
  CSVState CVar6;
  idx_t iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  CSVStateMachine *pCVar13;
  CSVBufferHandle *pCVar14;
  idx_t iVar15;
  ulong uVar16;
  idx_t iVar17;
  
  this_00 = &this->state_machine;
  pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  cVar2 = (pCVar13->dialect_options).state_machine_options.escape.value;
  pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  if ((((pCVar13->state_machine_options).strict_mode.value == true) &&
      (pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
      (pCVar13->state_machine_options).strict_mode.set_by_user == true)) &&
     (pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00),
     (pCVar13->state_machine_options).new_line.value == CARRY_ON)) {
    pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    cVar3 = (pCVar13->state_machine_options).new_line.set_by_user;
  }
  else {
    cVar3 = '\0';
  }
  iVar7 = (this->iterator).pos.buffer_pos;
  if ((this->iterator).is_set == true) {
    iVar15 = (this->iterator).boundary.end_pos;
    pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
    if (iVar15 <= pCVar14->actual_size) goto LAB_00ac3049;
  }
  pCVar14 = shared_ptr<duckdb::CSVBufferHandle,_true>::operator->(&this->cur_buffer_handle);
  iVar15 = pCVar14->actual_size;
LAB_00ac3049:
  uVar1 = iVar15 - 1;
  uVar16 = (this->iterator).pos.buffer_pos;
LAB_00ac305b:
  if (iVar15 <= uVar16) {
LAB_00ac3459:
    this->bytes_read = uVar16 - iVar7;
    return;
  }
  pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
  iVar17 = (this->iterator).pos.buffer_pos;
  bVar4 = this->buffer_handle_ptr[iVar17];
  CVar5 = (this->states).states[1];
  (this->states).states[0] = CVar5;
  CVar6 = pCVar13->transition_array->state_machine[bVar4][CVar5];
  (this->states).states[1] = CVar6;
  if (ESCAPED_RETURN < CVar6) goto switchD_00ac30a8_caseD_2;
  switch(CVar6) {
  case STANDARD:
    iVar17 = iVar17 + 1;
    while ((this->iterator).pos.buffer_pos = iVar17, iVar17 + 8 < iVar15) {
      uVar16 = *(ulong *)(this->buffer_handle_ptr + iVar17);
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      uVar11 = pCVar13->transition_array->delimiter;
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      uVar8 = pCVar13->transition_array->new_line;
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      uVar9 = pCVar13->transition_array->carriage_return;
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      uVar10 = pCVar13->transition_array->escape;
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      uVar16 = (uVar16 ^ pCVar13->transition_array->comment) &
               (uVar10 ^ uVar16) & (uVar9 ^ uVar16) & (uVar8 ^ uVar16) & (uVar11 ^ uVar16);
      if ((~(0x101010101010100 - uVar16 | uVar16) & 0x8080808080808080) != 0) break;
      iVar17 = (this->iterator).pos.buffer_pos + 8;
    }
    while( true ) {
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      uVar16 = (this->iterator).pos.buffer_pos;
      if ((uVar1 <= uVar16) ||
         (pCVar13->transition_array->skip_standard[(byte)this->buffer_handle_ptr[uVar16]] == false))
      break;
      (this->iterator).pos.buffer_pos = uVar16 + 1;
    }
    goto LAB_00ac305b;
  case DELIMITER:
    result->current_column_count = result->current_column_count + 1;
    break;
  case RECORD_SEPARATOR:
    if (CVar5 != 0xb) {
      if (CVar5 == CARRIAGE_RETURN) break;
      if (CVar5 != RECORD_SEPARATOR) {
        if ((result->super_ScannerResult).comment == true) {
          bVar12 = ColumnCountResult::UnsetComment(result,iVar17);
        }
        else {
          bVar12 = ColumnCountResult::AddRow(result,iVar17);
        }
        if (bVar12 != false) {
          iVar15 = (this->iterator).pos.buffer_pos + 1;
          (this->iterator).pos.buffer_pos = iVar15;
          this->bytes_read = iVar15 - iVar7;
          goto LAB_00ac34a0;
        }
        this->lines_read = this->lines_read + 1;
        goto LAB_00ac3312;
      }
    }
    this->lines_read = this->lines_read + 1;
    break;
  case CARRIAGE_RETURN:
    if ((NOT_SET < CVar5) || ((0x860U >> (CVar5 & 0x1f) & 1) == 0)) {
      if ((result->super_ScannerResult).comment == true) {
        bVar12 = ColumnCountResult::UnsetComment(result,iVar17);
      }
      else {
        if (cVar3 != '\0') goto LAB_00ac30d3;
        bVar12 = ColumnCountResult::AddRow(result,iVar17);
      }
      iVar17 = (this->iterator).pos.buffer_pos;
      if (bVar12 != false) {
        (this->iterator).pos.buffer_pos = iVar17 + 1;
        this->bytes_read = (iVar17 + 1) - iVar7;
LAB_00ac34a0:
        this->lines_read = this->lines_read + 1;
        return;
      }
    }
LAB_00ac30d3:
    uVar16 = iVar17 + 1;
    (this->iterator).pos.buffer_pos = uVar16;
    this->lines_read = this->lines_read + 1;
    goto LAB_00ac305b;
  case QUOTED:
    if (((CVar5 == MAYBE_QUOTED) || (CVar5 == UNQUOTED)) && (cVar2 != '\0')) {
      this->ever_escaped = true;
      (result->super_ScannerResult).escaped = true;
    }
    this->ever_quoted = true;
    if ((result->super_ScannerResult).quoted == false) {
      (result->super_ScannerResult).quoted_position = iVar17;
    }
    (result->super_ScannerResult).quoted = true;
    (result->super_ScannerResult).unquoted = true;
    iVar17 = iVar17 + 1;
    while ((this->iterator).pos.buffer_pos = iVar17, iVar17 + 8 < iVar15) {
      uVar16 = *(ulong *)(this->buffer_handle_ptr + iVar17);
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      uVar11 = pCVar13->transition_array->quote;
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      uVar16 = (uVar16 ^ pCVar13->transition_array->escape) & (uVar11 ^ uVar16);
      if ((~(0x101010101010100 - uVar16 | uVar16) & 0x8080808080808080) != 0) break;
      iVar17 = (this->iterator).pos.buffer_pos + 8;
    }
    while( true ) {
      pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
      uVar16 = (this->iterator).pos.buffer_pos;
      if ((uVar1 <= uVar16) ||
         (pCVar13->transition_array->skip_quoted[(byte)this->buffer_handle_ptr[uVar16]] == false))
      break;
      (this->iterator).pos.buffer_pos = uVar16 + 1;
    }
    goto LAB_00ac305b;
  case UNQUOTED:
    if (CVar5 == MAYBE_QUOTED) {
      this->ever_escaped = true;
      (result->super_ScannerResult).escaped = true;
    }
    ScannerResult::SetUnquoted(&result->super_ScannerResult);
LAB_00ac3312:
    iVar17 = (this->iterator).pos.buffer_pos;
    break;
  case ESCAPE:
  case UNQUOTED_ESCAPE:
  case ESCAPED_RETURN:
    (result->super_ScannerResult).escaped = true;
    this->ever_escaped = true;
    break;
  case INVALID:
    result->result_position = 0;
    result->error = true;
    uVar16 = iVar17 + 1;
    (this->iterator).pos.buffer_pos = uVar16;
    goto LAB_00ac3459;
  case COMMENT:
    goto switchD_00ac30a8_caseD_e;
  }
switchD_00ac30a8_caseD_2:
  uVar16 = iVar17 + 1;
  (this->iterator).pos.buffer_pos = uVar16;
  goto LAB_00ac305b;
switchD_00ac30a8_caseD_e:
  if (((result->super_ScannerResult).states)->states[0] != STANDARD) {
    result->cur_line_starts_as_comment = true;
  }
  (result->super_ScannerResult).comment = true;
  iVar17 = iVar17 + 1;
  while ((this->iterator).pos.buffer_pos = iVar17, iVar17 + 8 < iVar15) {
    uVar16 = *(ulong *)(this->buffer_handle_ptr + iVar17);
    pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    uVar11 = pCVar13->transition_array->new_line;
    pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    uVar16 = (uVar16 ^ pCVar13->transition_array->carriage_return) & (uVar11 ^ uVar16);
    if ((~(0x101010101010100 - uVar16 | uVar16) & 0x8080808080808080) != 0) break;
    iVar17 = (this->iterator).pos.buffer_pos + 8;
  }
  while( true ) {
    pCVar13 = shared_ptr<duckdb::CSVStateMachine,_true>::operator->(this_00);
    uVar16 = (this->iterator).pos.buffer_pos;
    if ((uVar1 <= uVar16) ||
       (pCVar13->transition_array->skip_comment[(byte)this->buffer_handle_ptr[uVar16]] == false))
    break;
    (this->iterator).pos.buffer_pos = uVar16 + 1;
  }
  goto LAB_00ac305b;
}

Assistant:

void Process(T &result) {
		idx_t to_pos;
		const bool has_escaped_value = state_machine->dialect_options.state_machine_options.escape != '\0';
		const bool only_rn_newlines =
		    state_machine->state_machine_options.strict_mode.GetValue() &&
		    state_machine->state_machine_options.strict_mode.IsSetByUser() &&
		    state_machine->state_machine_options.new_line.GetValue() == NewLineIdentifier::CARRY_ON &&
		    state_machine->state_machine_options.new_line.IsSetByUser();
		const idx_t start_pos = iterator.pos.buffer_pos;
		if (iterator.IsBoundarySet()) {
			to_pos = iterator.GetEndPos();
			if (to_pos > cur_buffer_handle->actual_size) {
				to_pos = cur_buffer_handle->actual_size;
			}
		} else {
			to_pos = cur_buffer_handle->actual_size;
		}
		while (iterator.pos.buffer_pos < to_pos) {
			state_machine->Transition(states, buffer_handle_ptr[iterator.pos.buffer_pos]);
			switch (states.states[1]) {
			case CSVState::INVALID:
				T::InvalidState(result);
				iterator.pos.buffer_pos++;
				bytes_read = iterator.pos.buffer_pos - start_pos;
				return;
			case CSVState::RECORD_SEPARATOR:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
					lines_read++;

				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
					lines_read++;
				}
				iterator.pos.buffer_pos++;
				break;
			case CSVState::CARRIAGE_RETURN:
				if (states.states[0] == CSVState::RECORD_SEPARATOR || states.states[0] == CSVState::NOT_SET) {
					if (T::EmptyLine(result, iterator.pos.buffer_pos)) {
						iterator.pos.buffer_pos++;
						bytes_read = iterator.pos.buffer_pos - start_pos;
						lines_read++;
						return;
					}
				} else if (states.states[0] != CSVState::CARRIAGE_RETURN) {
					if (T::IsCommentSet(result)) {
						if (T::UnsetComment(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					} else if (!only_rn_newlines) {
						if (T::AddRow(result, iterator.pos.buffer_pos)) {
							iterator.pos.buffer_pos++;
							bytes_read = iterator.pos.buffer_pos - start_pos;
							lines_read++;
							return;
						}
					}
				}
				iterator.pos.buffer_pos++;
				lines_read++;
				break;
			case CSVState::DELIMITER:
				T::AddValue(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::QUOTED: {
				if ((states.states[0] == CSVState::UNQUOTED || states.states[0] == CSVState::MAYBE_QUOTED) &&
				    has_escaped_value) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				ever_quoted = true;
				T::SetQuoted(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.quote) &
					                     (value ^ state_machine->transition_array.escape))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}

				while (state_machine->transition_array
				           .skip_quoted[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
			} break;
			case CSVState::UNQUOTED: {
				if (states.states[0] == CSVState::MAYBE_QUOTED) {
					ever_escaped = true;
					T::SetEscaped(result);
				}
				T::SetUnquoted(result);
				iterator.pos.buffer_pos++;
				break;
			}
			case CSVState::ESCAPE:
			case CSVState::UNQUOTED_ESCAPE:
			case CSVState::ESCAPED_RETURN:
				T::SetEscaped(result);
				ever_escaped = true;
				iterator.pos.buffer_pos++;
				break;
			case CSVState::STANDARD: {
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.delimiter) &
					                     (value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return) &
					                     (value ^ state_machine->transition_array.escape) &
					                     (value ^ state_machine->transition_array.comment))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_standard[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			case CSVState::QUOTED_NEW_LINE:
				T::QuotedNewLine(result);
				iterator.pos.buffer_pos++;
				break;
			case CSVState::COMMENT: {
				T::SetComment(result, iterator.pos.buffer_pos);
				iterator.pos.buffer_pos++;
				while (iterator.pos.buffer_pos + 8 < to_pos) {
					const uint64_t value =
					    Load<uint64_t>(reinterpret_cast<const_data_ptr_t>(&buffer_handle_ptr[iterator.pos.buffer_pos]));
					if (ContainsZeroByte((value ^ state_machine->transition_array.new_line) &
					                     (value ^ state_machine->transition_array.carriage_return))) {
						break;
					}
					iterator.pos.buffer_pos += 8;
				}
				while (state_machine->transition_array
				           .skip_comment[static_cast<uint8_t>(buffer_handle_ptr[iterator.pos.buffer_pos])] &&
				       iterator.pos.buffer_pos < to_pos - 1) {
					iterator.pos.buffer_pos++;
				}
				break;
			}
			default:
				iterator.pos.buffer_pos++;
				break;
			}
		}
		bytes_read = iterator.pos.buffer_pos - start_pos;
	}